

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::ArchiveOUT(ChLinkMateGeneric *this,ChArchiveOut *marchive)

{
  ChNameValue<bool> local_d8;
  ChNameValue<bool> local_c0;
  ChNameValue<bool> local_a8;
  ChNameValue<bool> local_90;
  ChNameValue<bool> local_78;
  ChNameValue<bool> local_60;
  ChNameValue<chrono::ChFrame<double>_> local_48;
  ChNameValue<chrono::ChFrame<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMateGeneric>(marchive);
  ChLinkMate::ArchiveOUT(&this->super_ChLinkMate,marchive);
  local_30._value = &this->frame1;
  local_30._name = "frame1";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->frame2;
  local_48._name = "frame2";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->c_x;
  local_60._name = "c_x";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->c_y;
  local_78._name = "c_y";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->c_z;
  local_90._name = "c_z";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->c_rx;
  local_a8._name = "c_rx";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._value = &this->c_ry;
  local_c0._name = "c_ry";
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c0);
  local_d8._value = &this->c_rz;
  local_d8._name = "c_rz";
  local_d8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_d8);
  return;
}

Assistant:

void ChLinkMateGeneric::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMateGeneric>();

    // serialize parent class
    ChLinkMate::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(frame1);
    marchive << CHNVP(frame2);
    marchive << CHNVP(c_x);
    marchive << CHNVP(c_y);
    marchive << CHNVP(c_z);
    marchive << CHNVP(c_rx);
    marchive << CHNVP(c_ry);
    marchive << CHNVP(c_rz);
}